

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_scan.c
# Opt level: O0

int GET(_PDCLIB_status_t *status)

{
  byte bVar1;
  char *pcVar2;
  unsigned_long uVar3;
  _PDCLIB_file_t *p_Var4;
  byte *pbVar5;
  uint local_20;
  uint local_1c;
  int local_18;
  uint local_14;
  int rc;
  _PDCLIB_status_t *status_local;
  
  local_14 = 0xffffffff;
  if (status->stream == (_PDCLIB_file_t *)0x0) {
    if (*status->s == '\0') {
      local_20 = 0xffffffff;
    }
    else {
      pbVar5 = (byte *)status->s;
      status->s = (char *)(pbVar5 + 1);
      local_20 = (uint)*pbVar5;
    }
    local_14 = local_20;
  }
  else {
    if ((status->stream->bufidx == status->stream->bufend) && (status->stream->ungetidx == 0)) {
      local_18 = _PDCLIB_fillbuffer(status->stream);
    }
    else {
      local_18 = 0;
    }
    if (local_18 != -1) {
      if (status->stream->ungetidx == 0) {
        pcVar2 = status->stream->buffer;
        uVar3 = status->stream->bufidx;
        status->stream->bufidx = uVar3 + 1;
        bVar1 = pcVar2[uVar3];
      }
      else {
        p_Var4 = status->stream;
        uVar3 = status->stream->ungetidx;
        status->stream->ungetidx = uVar3 - 1;
        bVar1 = p_Var4->ungetbuf[uVar3 - 1];
      }
      local_1c = (uint)bVar1;
      local_14 = local_1c;
    }
  }
  if (local_14 != 0xffffffff) {
    status->i = status->i + 1;
    status->current = status->current + 1;
  }
  return local_14;
}

Assistant:

static int GET( struct _PDCLIB_status_t * status )
{
    int rc = EOF;

    if ( status->stream != NULL )
    {
        if ( _PDCLIB_CHECKBUFFER( status->stream ) != EOF )
        {
            rc = _PDCLIB_GETC( status->stream );
        }
    }
    else
    {
        rc = ( *status->s == '\0' ) ? EOF : ( unsigned char ) * ( ( status->s )++ );
    }

    if ( rc != EOF )
    {
        ++( status->i );
        ++( status->current );
    }

    return rc;
}